

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

uint16_t __thiscall Handler::Purchase(Handler *this,VirtualMachine *vm)

{
  bool bVar1;
  PurchasedServer *this_00;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pRVar5;
  reference pvVar6;
  VirtualMachine *in_RSI;
  PurchasedServer *in_RDI;
  RequestResult *res_1;
  iterator __end3_3;
  iterator __begin3_3;
  vector<RequestResult,_std::allocator<RequestResult>_> *__range3_3;
  vector<RequestResult,_std::allocator<RequestResult>_> *requestResult;
  MigrateResult *res;
  iterator __end3_2;
  iterator __begin3_2;
  vector<MigrateResult,_std::allocator<MigrateResult>_> *__range3_2;
  vector<MigrateResult,_std::allocator<MigrateResult>_> *migrateResult;
  PurchasedServer *item;
  iterator __end3_1;
  iterator __begin3_1;
  vector<PurchasedServer,_std::allocator<PurchasedServer>_> *__range3_1;
  DeployedVirtualMachine *deployedVM;
  iterator __end3;
  iterator __begin3;
  vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_> *__range3;
  int i_1;
  bool exist;
  int n;
  int resultIdx;
  uint16_t id;
  vector<ExtendResult,_std::allocator<ExtendResult>_> *extendResult;
  PurchasedServer *purchasedServer;
  Server *server;
  uint8_t i;
  uint8_t serverIdx;
  vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_> *in_stack_ffffffffffffff08
  ;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  __normal_iterator<RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
  local_c8;
  vector<RequestResult,_std::allocator<RequestResult>_> *local_c0;
  vector<RequestResult,_std::allocator<RequestResult>_> *local_b8;
  reference local_b0;
  MigrateResult *local_a8;
  __normal_iterator<MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
  local_a0;
  vector<MigrateResult,_std::allocator<MigrateResult>_> *local_98;
  vector<MigrateResult,_std::allocator<MigrateResult>_> *local_90;
  reference local_88;
  PurchasedServer *local_80;
  __normal_iterator<PurchasedServer_*,_std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>_>
  local_78;
  _Prime_rehash_policy *local_70;
  reference local_68;
  DeployedVirtualMachine *local_60;
  __normal_iterator<DeployedVirtualMachine_*,_std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>_>
  local_58;
  PurchasedServer *local_50;
  int local_44;
  byte local_3d;
  int local_3c;
  int local_38;
  uint16_t local_32;
  reference local_30;
  PurchasedServer *local_28;
  reference local_20;
  byte local_12;
  byte local_11;
  VirtualMachine *local_10;
  
  local_11 = *(char *)((long)&(in_RDI->deployedVM)._M_h._M_before_begin._M_nxt + 4) - 1;
  local_10 = in_RSI;
  for (local_12 = 0;
      local_12 < *(byte *)((long)&(in_RDI->deployedVM)._M_h._M_before_begin._M_nxt + 4);
      local_12 = local_12 + 1) {
    local_20 = std::vector<Server,_std::allocator<Server>_>::operator[]
                         ((vector<Server,_std::allocator<Server>_> *)
                          &(in_RDI->deployedVM)._M_h._M_rehash_policy,(ulong)local_12);
    bVar1 = CheckCapacity(local_20,local_10);
    if (bVar1) {
      local_11 = local_12;
      break;
    }
  }
  this_00 = (PurchasedServer *)operator_new(0x48);
  memset(this_00,0,0x48);
  PurchasedServer::PurchasedServer(this_00);
  local_28 = this_00;
  local_30 = std::vector<Result,_std::allocator<Result>_>::operator[]
                       ((vector<Result,_std::allocator<Result>_> *)
                        &in_RDI[0x16ce].deployedVM._M_h._M_element_count,
                        (ulong)(ushort)in_RDI[0x16ce].deployedVM._M_h._M_bucket_count);
  local_32 = *(uint16_t *)&in_RDI[0x16ce].deployedVM._M_h._M_before_begin._M_nxt;
  local_38 = 0;
  sVar2 = std::vector<ExtendResult,_std::allocator<ExtendResult>_>::size(&local_30->extendResult);
  local_3c = (int)sVar2;
  local_3d = 0;
  local_44 = 0;
  do {
    if (local_3c <= local_44) {
LAB_0012b915:
      if ((local_3d & 1) == 0) {
        in_stack_ffffffffffffff24 = 1;
        std::vector<ExtendResult,std::allocator<ExtendResult>>::
        emplace_back<unsigned_char&,unsigned_int>
                  ((vector<ExtendResult,_std::allocator<ExtendResult>_> *)
                   CONCAT44(1,in_stack_ffffffffffffff20),(uchar *)in_RDI,(uint *)this_00);
      }
      else if (local_38 < local_3c + -1) {
        local_50 = in_RDI + 0x16ce;
        local_58._M_current =
             (DeployedVirtualMachine *)
             std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>::begin
                       (in_stack_ffffffffffffff08);
        local_60 = (DeployedVirtualMachine *)
                   std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>::end
                             (in_stack_ffffffffffffff08);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<DeployedVirtualMachine_*,_std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>_>
                                   *)this_00,
                                  (__normal_iterator<DeployedVirtualMachine_*,_std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>_>
                                   *)in_stack_ffffffffffffff08), bVar1) {
          local_68 = __gnu_cxx::
                     __normal_iterator<DeployedVirtualMachine_*,_std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>_>
                     ::operator*(&local_58);
          if (local_32 <= local_68->purchasedServerId) {
            local_68->purchasedServerId = local_68->purchasedServerId + 1;
          }
          __gnu_cxx::
          __normal_iterator<DeployedVirtualMachine_*,_std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>_>
          ::operator++(&local_58);
        }
        local_70 = &in_RDI[0x16cd].deployedVM._M_h._M_rehash_policy;
        local_78._M_current =
             (PurchasedServer *)
             std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::begin
                       ((vector<PurchasedServer,_std::allocator<PurchasedServer>_> *)
                        in_stack_ffffffffffffff08);
        local_80 = (PurchasedServer *)
                   std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::end
                             ((vector<PurchasedServer,_std::allocator<PurchasedServer>_> *)
                              in_stack_ffffffffffffff08);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<PurchasedServer_*,_std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>_>
                                   *)this_00,
                                  (__normal_iterator<PurchasedServer_*,_std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>_>
                                   *)in_stack_ffffffffffffff08), bVar1) {
          local_88 = __gnu_cxx::
                     __normal_iterator<PurchasedServer_*,_std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>_>
                     ::operator*(&local_78);
          if (local_32 <= local_88->id) {
            local_88->id = local_88->id + 1;
          }
          __gnu_cxx::
          __normal_iterator<PurchasedServer_*,_std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>_>
          ::operator++(&local_78);
        }
        ReMapPurchasedServerIdx
                  ((Handler *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        pvVar4 = std::vector<Result,_std::allocator<Result>_>::operator[]
                           ((vector<Result,_std::allocator<Result>_> *)
                            &in_RDI[0x16ce].deployedVM._M_h._M_element_count,
                            (ulong)(ushort)in_RDI[0x16ce].deployedVM._M_h._M_bucket_count);
        local_98 = &pvVar4->migrateResult;
        local_90 = local_98;
        local_a0._M_current =
             (MigrateResult *)
             std::vector<MigrateResult,_std::allocator<MigrateResult>_>::begin
                       ((vector<MigrateResult,_std::allocator<MigrateResult>_> *)
                        in_stack_ffffffffffffff08);
        local_a8 = (MigrateResult *)
                   std::vector<MigrateResult,_std::allocator<MigrateResult>_>::end
                             ((vector<MigrateResult,_std::allocator<MigrateResult>_> *)
                              in_stack_ffffffffffffff08);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
                                   *)this_00,
                                  (__normal_iterator<MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
                                   *)in_stack_ffffffffffffff08), bVar1) {
          local_b0 = __gnu_cxx::
                     __normal_iterator<MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
                     ::operator*(&local_a0);
          if (local_32 <= local_b0->purchasedServerId) {
            local_b0->purchasedServerId = local_b0->purchasedServerId + 1;
          }
          __gnu_cxx::
          __normal_iterator<MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
          ::operator++(&local_a0);
        }
        pvVar4 = std::vector<Result,_std::allocator<Result>_>::operator[]
                           ((vector<Result,_std::allocator<Result>_> *)
                            &in_RDI[0x16ce].deployedVM._M_h._M_element_count,
                            (ulong)(ushort)in_RDI[0x16ce].deployedVM._M_h._M_bucket_count);
        local_c0 = &pvVar4->requestResult;
        local_b8 = local_c0;
        local_c8._M_current =
             (RequestResult *)
             std::vector<RequestResult,_std::allocator<RequestResult>_>::begin
                       ((vector<RequestResult,_std::allocator<RequestResult>_> *)
                        in_stack_ffffffffffffff08);
        std::vector<RequestResult,_std::allocator<RequestResult>_>::end
                  ((vector<RequestResult,_std::allocator<RequestResult>_> *)
                   in_stack_ffffffffffffff08);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
                                   *)this_00,
                                  (__normal_iterator<RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
                                   *)in_stack_ffffffffffffff08), bVar1) {
          pRVar5 = __gnu_cxx::
                   __normal_iterator<RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
                   ::operator*(&local_c8);
          if (local_32 <= pRVar5->purchasedServerId) {
            pRVar5->purchasedServerId = pRVar5->purchasedServerId + 1;
          }
          __gnu_cxx::
          __normal_iterator<RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
          ::operator++(&local_c8);
        }
      }
      local_28->id = local_32;
      local_28->serverIdx = local_11;
      pvVar6 = std::vector<Server,_std::allocator<Server>_>::operator[]
                         ((vector<Server,_std::allocator<Server>_> *)
                          &(in_RDI->deployedVM)._M_h._M_rehash_policy,(ulong)local_11);
      local_28->remainCpuCoreA = (uint16_t)((int)(uint)pvVar6->cpuCore >> 1);
      pvVar6 = std::vector<Server,_std::allocator<Server>_>::operator[]
                         ((vector<Server,_std::allocator<Server>_> *)
                          &(in_RDI->deployedVM)._M_h._M_rehash_policy,(ulong)local_11);
      local_28->remainCpuCoreB = (uint16_t)((int)(uint)pvVar6->cpuCore >> 1);
      pvVar6 = std::vector<Server,_std::allocator<Server>_>::operator[]
                         ((vector<Server,_std::allocator<Server>_> *)
                          &(in_RDI->deployedVM)._M_h._M_rehash_policy,(ulong)local_11);
      local_28->remainMemorySizeA = (uint16_t)((int)(uint)pvVar6->memorySize >> 1);
      pvVar6 = std::vector<Server,_std::allocator<Server>_>::operator[]
                         ((vector<Server,_std::allocator<Server>_> *)
                          &(in_RDI->deployedVM)._M_h._M_rehash_policy,(ulong)local_11);
      local_28->remainMemorySizeB = (uint16_t)((int)(uint)pvVar6->memorySize >> 1);
      sVar2 = std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::size
                        ((vector<PurchasedServer,_std::allocator<PurchasedServer>_> *)
                         &in_RDI[0x16cd].deployedVM._M_h._M_rehash_policy);
      *(short *)((long)&in_RDI[4].deployedVM._M_h._M_bucket_count + (ulong)local_32 * 2) =
           (short)sVar2;
      std::vector<PurchasedServer,std::allocator<PurchasedServer>>::emplace_back<PurchasedServer&>
                ((vector<PurchasedServer,_std::allocator<PurchasedServer>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),in_RDI);
      pvVar6 = std::vector<Server,_std::allocator<Server>_>::operator[]
                         ((vector<Server,_std::allocator<Server>_> *)
                          &(in_RDI->deployedVM)._M_h._M_rehash_policy,(ulong)local_11);
      in_RDI[0x16d6].deployedVM._M_h._M_buckets =
           (__buckets_ptr)
           ((ulong)pvVar6->hardwareCost + (long)in_RDI[0x16d6].deployedVM._M_h._M_buckets);
      return *(uint16_t *)((long)&in_RDI[4].deployedVM._M_h._M_bucket_count + (ulong)local_32 * 2);
    }
    pvVar3 = std::vector<ExtendResult,_std::allocator<ExtendResult>_>::operator[]
                       (&local_30->extendResult,(long)local_44);
    local_32 = local_32 + pvVar3->purchaseNum;
    pvVar3 = std::vector<ExtendResult,_std::allocator<ExtendResult>_>::operator[]
                       (&local_30->extendResult,(long)local_44);
    if (pvVar3->serverIdx == local_11) {
      pvVar3 = std::vector<ExtendResult,_std::allocator<ExtendResult>_>::operator[]
                         (&local_30->extendResult,(long)local_44);
      pvVar3->purchaseNum = pvVar3->purchaseNum + 1;
      local_3d = 1;
      local_38 = local_44;
      goto LAB_0012b915;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

uint16_t Handler::Purchase(const VirtualMachine &vm) {
    uint8_t serverIdx = N - 1u;
    for (uint8_t i = 0u; i < N; ++i) {
        Server &server = servers[i];
        if (CheckCapacity(server, vm)) {
            serverIdx = i;
            break;
        }
    }

    auto *purchasedServer = new PurchasedServer();
    std::vector<ExtendResult> &extendResult = result[today].extendResult;
    uint16_t id = totalPurchasedServerNum;
    int resultIdx = 0, n = (int) extendResult.size();
    bool exist = false;
    for (int i = 0; i < n; ++i) {
        id += extendResult[i].purchaseNum;
        if (extendResult[i].serverIdx == serverIdx) {   // 买过同一型号的 server
            ++extendResult[i].purchaseNum;   // 数量加一表示多买一个
            exist = true;
            resultIdx = i;
            break;
        }
    }

    // 已经购买过这一类型的服务器
    if (exist) {
        if (resultIdx < n - 1) {  // 不是 extendResult 中的最后一个种类
            for (DeployedVirtualMachine &deployedVM : deployedVMs) {
                if (deployedVM.purchasedServerId >= id) ++deployedVM.purchasedServerId;
            }
            for (PurchasedServer &item : purchasedServers) {
                if (item.id >= id) ++item.id;
            }
            ReMapPurchasedServerIdx();

            std::vector<MigrateResult> &migrateResult = result[today].migrateResult;
            for (MigrateResult &res : migrateResult) {
                if (res.purchasedServerId >= id) ++res.purchasedServerId;
            }
            std::vector<RequestResult> &requestResult = result[today].requestResult;
            for (RequestResult &res : requestResult) {
                if (res.purchasedServerId >= id) ++res.purchasedServerId;
            }
        }
    } else {
        extendResult.emplace_back(serverIdx, 1u);
    }

    purchasedServer->id = id;
    purchasedServer->serverIdx = serverIdx;
    purchasedServer->remainCpuCoreA = (servers[serverIdx].cpuCore >> 1u);
    purchasedServer->remainCpuCoreB = (servers[serverIdx].cpuCore >> 1u);
    purchasedServer->remainMemorySizeA = (servers[serverIdx].memorySize >> 1u);
    purchasedServer->remainMemorySizeB = (servers[serverIdx].memorySize >> 1u);
    purchasedServerIdxMap[id] = purchasedServers.size();
    purchasedServers.emplace_back(*purchasedServer);

#ifdef TEST
    totalHardwareCost += servers[serverIdx].hardwareCost;
#endif

    return purchasedServerIdxMap[id];
}